

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool sx_strnequal(char *a,char *b,int num)

{
  bool bVar1;
  int var__b_1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int var__b;
  int var__a;
  
  uVar2 = sx_strlen(a);
  uVar3 = sx_strlen(b);
  if (num <= (int)uVar2) {
    uVar2 = num;
  }
  if ((int)uVar3 < num) {
    num = uVar3;
  }
  if (uVar2 == num) {
    if ((int)uVar2 < 1) {
      bVar1 = true;
    }
    else {
      uVar4 = 0;
      do {
        if (a[uVar4] != b[uVar4]) goto LAB_00107e94;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      bVar1 = uVar2 <= uVar4;
    }
  }
  else {
LAB_00107e94:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool sx_strnequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b, int num)
{
    int _alen = sx_strlen(a);
    int _blen = sx_strlen(b);
    int alen = sx_min(num, _alen);
    int blen = sx_min(num, _blen);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}